

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O3

bool __thiscall dap::json::JsonCppSerializer::serialize(JsonCppSerializer *this,object *v)

{
  bool bVar1;
  __node_base *p_Var2;
  JsonCppSerializer s;
  undefined1 local_50 [16];
  undefined2 local_40;
  
  bVar1 = Json::Value::isObject(this->json);
  if (!bVar1) {
    Json::Value::Value((Value *)local_50,objectValue);
    Json::Value::operator=(this->json,(Value *)local_50);
    Json::Value::~Value((Value *)local_50);
  }
  p_Var2 = &(v->_M_h)._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    local_50._8_8_ = Json::Value::operator[](this->json,(String *)(p_Var2 + 1));
    local_50._0_8_ = &PTR__JsonCppSerializer_00aa5740;
    local_40._0_1_ = false;
    local_40._1_1_ = false;
    bVar1 = serialize((JsonCppSerializer *)local_50,(any *)(p_Var2 + 5));
    ~JsonCppSerializer((JsonCppSerializer *)local_50);
  } while (bVar1);
  return p_Var2 == (__node_base *)0x0;
}

Assistant:

bool JsonCppSerializer::serialize(const dap::object& v) {
  if (!json->isObject()) {
    *json = Json::Value(Json::objectValue);
  }
  for (auto& it : v) {
    JsonCppSerializer s(&(*json)[it.first]);
    if (!s.serialize(it.second)) {
      return false;
    }
  }
  return true;
}